

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bucket.c
# Opt level: O1

bucket bucket_create(size_t size)

{
  void *__s;
  bucket pbVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  if (size == 0) {
    pcVar3 = "Invalid bucket size: %zu";
    uVar2 = 0x7b;
  }
  else {
    __s = malloc(size * 0x18);
    if (__s != (void *)0x0) {
      pbVar1 = (bucket)memset(__s,0,size * 0x18);
      return pbVar1;
    }
    pcVar3 = "Bad allocation for bucket";
    uVar2 = 0x83;
  }
  log_write_impl_va("metacall",uVar2,"bucket_create",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_bucket.c"
                    ,3,pcVar3);
  return (bucket)0x0;
}

Assistant:

bucket bucket_create(size_t size)
{
	bucket buckets;

	size_t iterator;

	if (size == 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid bucket size: %" PRIuS, size);
		return NULL;
	}

	buckets = malloc(sizeof(struct bucket_type) * size);

	if (buckets == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Bad allocation for bucket");
		return NULL;
	}

	for (iterator = 0; iterator < size; ++iterator)
	{
		buckets[iterator].count = 0;
		buckets[iterator].capacity = 0;
		buckets[iterator].pairs = NULL;
	}

	return buckets;
}